

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O2

float __thiscall asl::Var::operator_cast_to_float(Var *this)

{
  anon_union_8_8_7df20137_for_Var_3 __nptr;
  float fVar1;
  double dVar2;
  
  fVar1 = 0.0;
  switch(this->_type) {
  case NUL:
    dVar2 = nan((char *)this);
    return SUB84(dVar2,0);
  case NUMBER:
  case FLOAT:
    fVar1 = (float)(this->field_1)._d;
    break;
  case INT:
    fVar1 = (float)(this->field_1)._i;
    break;
  case SSTRING:
    __nptr._l = (Long)&this->field_1;
    goto LAB_00130859;
  case STRING:
    __nptr = this->field_1;
LAB_00130859:
    dVar2 = atof(__nptr._d);
    fVar1 = (float)dVar2;
  }
  return fVar1;
}

Assistant:

Var::operator float() const
{
	switch(_type) {
	case NUMBER:
	case FLOAT:
		return (float)_d;
	case INT:
		return (float)_i;
	case STRING:
		return (float)atof(_s->data());
	case SSTRING:
		return (float)atof(_ss);
	case NUL:
		return nan();
	default: break;
	}
	return 0.0; // NaN ?
}